

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

void dns_handler(mg_connection *nc,int ev,void *ev_data)

{
  mbuf *mb;
  ushort uVar1;
  int iVar2;
  uint16_t len;
  mg_dns_message msg;
  
  (*nc->handler)(nc,ev,ev_data);
  if (ev == 3) {
    mb = &nc->recv_mbuf;
    if ((nc->flags & 2) == 0) {
      mbuf_remove(mb,2);
    }
    iVar2 = mg_parse_dns((nc->recv_mbuf).buf,(int)(nc->recv_mbuf).len,&msg);
    if (iVar2 == -1) {
      memset(&msg,0,0xc20);
      msg.flags = 0x8081;
      mg_dns_insert_header(mb,0,&msg);
      if ((nc->flags & 2) == 0) {
        uVar1 = (ushort)(nc->recv_mbuf).len;
        len = uVar1 << 8 | uVar1 >> 8;
        mbuf_insert(mb,0,&len,2);
      }
      mg_send(nc,(nc->recv_mbuf).buf,(int)(nc->recv_mbuf).len);
    }
    else {
      (*nc->handler)(nc,100,&msg);
    }
    mbuf_remove(mb,(nc->recv_mbuf).len);
  }
  return;
}

Assistant:

static void dns_handler(struct mg_connection *nc, int ev, void *ev_data) {
    struct mbuf *io = &nc->recv_mbuf;
    struct mg_dns_message msg;

    /* Pass low-level events to the user handler */
    nc->handler(nc, ev, ev_data);

    switch (ev) {
        case MG_EV_RECV:
            if (!(nc->flags & MG_F_UDP)) {
                mbuf_remove(&nc->recv_mbuf, 2);
            }
            if (mg_parse_dns(nc->recv_mbuf.buf, nc->recv_mbuf.len, &msg) == -1) {
                /* reply + recursion allowed + format error */
                memset(&msg, 0, sizeof(msg));
                msg.flags = 0x8081;
                mg_dns_insert_header(io, 0, &msg);
                if (!(nc->flags & MG_F_UDP)) {
                    uint16_t len = htons(io->len);
                    mbuf_insert(io, 0, &len, 2);
                }
                mg_send(nc, io->buf, io->len);
            } else {
                /* Call user handler with parsed message */
                nc->handler(nc, MG_DNS_MESSAGE, &msg);
            }
            mbuf_remove(io, io->len);
            break;
    }
}